

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O2

void __thiscall
Function_Pool::FunctionTask::GammaCorrection
          (FunctionTask *this,Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,
          uint32_t startXOut,uint32_t startYOut,uint32_t width,uint32_t height,double a,double gamma
          )

{
  imageException *this_00;
  
  FunctionPoolTask::_setup
            (&this->super_FunctionPoolTask,in,startXIn,startYIn,out,startXOut,startYOut,width,height
            );
  if ((0.0 <= a) && (0.0 <= gamma)) {
    (this->_dataIn).coefficientA = a;
    (this->_dataIn).coefficientGamma = gamma;
    this->functionId = _GammaCorrection;
    FunctionPoolTask::_processTask(&this->super_FunctionPoolTask);
    return;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_00,"Bad input parameters in image function");
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void GammaCorrection( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                              uint32_t width, uint32_t height, double a, double gamma )
        {
            _setup( in, startXIn, startYIn, out, startXOut, startYOut, width, height );

            if( a < 0 || gamma < 0 )
                throw imageException( "Bad input parameters in image function" );

            _dataIn.coefficientA     = a;
            _dataIn.coefficientGamma = gamma;

            _process( _GammaCorrection );
        }